

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SequenceMethodExprVisitor::visit<slang::ast::UnaryAssertionExpr>
          (SequenceMethodExprVisitor *this,UnaryAssertionExpr *expr)

{
  UnaryAssertionExpr *in_RSI;
  SequenceMethodExprVisitor *in_stack_ffffffffffffffe8;
  
  UnaryAssertionExpr::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.kind == ExpressionKind::NamedValue) {
                if (auto sym = expr.getSymbolReference()) {
                    if (sym->kind == SymbolKind::LocalAssertionVar ||
                        (sym->kind == SymbolKind::AssertionPort &&
                         sym->template as<AssertionPortSymbol>().isLocalVar())) {
                        context.addDiag(diag::SequenceMethodLocalVar, expr.sourceRange) << name;
                    }
                }
            }
        }

        if constexpr (HasVisitExprs<T, SequenceMethodExprVisitor>)
            expr.visitExprs(*this);
    }